

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QTableView::paintEvent(QTableView *this,QPaintEvent *event)

{
  bool bVar1;
  QWidget *pQVar2;
  QAbstractItemModel *pQVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  QTableViewPrivate *pQVar15;
  QStyle *pQVar16;
  int *piVar17;
  undefined8 *puVar18;
  long lVar19;
  qsizetype qVar20;
  QPen *pQVar21;
  QPaintEvent *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int colX;
  int col_2;
  int rowY_2;
  int row_3;
  bool drawWhenHidden;
  int colp_1;
  int col_1;
  int h;
  int rowh_1;
  int rowY_1;
  int row_2;
  int visualIndex;
  int colw;
  int colp;
  int col;
  int currentBit;
  int visualColumnIndex;
  int rowh;
  int rowY;
  int row_1;
  int visualRowIndex;
  int y_1;
  int row;
  int verticalOffset;
  bool alternateBase;
  int top;
  int bottom;
  const_iterator __end1;
  const_iterator __begin1;
  QRegion *__range1;
  int lastVisualRow;
  int firstVisualRow;
  int y;
  int x;
  bool rightToLeft;
  bool alternate;
  QHeaderView *horizontalHeader;
  QHeaderView *verticalHeader;
  int gridHint;
  int gridSize;
  bool showGrid;
  QTableViewPrivate *d;
  QLineF line_1;
  QLineF line;
  QPen old;
  QModelIndex index;
  int right;
  int left;
  QRect dirtyArea;
  QRegion region;
  QBitArray drawn;
  int lastVisualColumn;
  int firstVisualColumn;
  QPainter painter;
  QPen gridPen;
  QPoint offset;
  QColor gridColor;
  QStyleOptionViewItem option;
  int in_stack_fffffffffffffba8;
  int in_stack_fffffffffffffbac;
  int in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  int in_stack_fffffffffffffbb8;
  int in_stack_fffffffffffffbbc;
  int in_stack_fffffffffffffbc0;
  int in_stack_fffffffffffffbc4;
  int in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbcc;
  int in_stack_fffffffffffffbd0;
  int in_stack_fffffffffffffbd4;
  int in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbdc;
  int in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffbe4;
  int in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbec;
  byte local_3d1;
  int in_stack_fffffffffffffc44;
  QBitArray *in_stack_fffffffffffffc48;
  QStyleOptionViewItem *in_stack_fffffffffffffc50;
  undefined6 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5e;
  undefined1 in_stack_fffffffffffffc5f;
  QRegion *in_stack_fffffffffffffc60;
  QTableViewPrivate *in_stack_fffffffffffffc68;
  QPaintDevice *local_338;
  int local_32c;
  int local_310;
  uint local_300;
  int local_2ec;
  uint local_2dc;
  int local_2d8;
  byte local_2c9;
  uint local_2c8;
  int local_2c4;
  undefined8 *local_2b8;
  int local_2a8;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe30;
  undefined4 uStack_1cc;
  undefined1 *local_1c8;
  QPersistentModelIndex local_1c0 [3];
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  undefined8 local_170;
  undefined8 local_168;
  QRegion local_160;
  QBitArray local_158;
  int local_140;
  int local_13c;
  QPersistentModelIndex local_138 [3];
  int local_120;
  int local_11c;
  undefined1 *local_118;
  QBrush local_110 [8];
  undefined1 *local_108;
  undefined1 local_100 [16];
  QPoint local_f0;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined8 uStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar15 = d_func((QTableView *)0x8b70a1);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x8b7135);
  (**(code **)(*in_RDI + 0x2f8))(in_RDI,&local_d8);
  local_f0 = (pQVar15->super_QAbstractItemViewPrivate).scrollDelayOffset;
  bVar1 = pQVar15->showGrid;
  pQVar16 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8))
  ;
  uVar7 = (**(code **)(*(long *)pQVar16 + 0xf0))(pQVar16,0x22,&local_d8,in_RDI,0);
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
  local_100 = QColor::fromRgba(uVar7);
  local_e8 = local_100._0_8_;
  puStack_e0._0_6_ = local_100._8_6_;
  local_108 = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush(local_110,(QColor *)&local_e8,SolidPattern);
  QPen::QPen((QPen *)&local_108,local_110,1.0,pQVar15->gridStyle,SquareCap,BevelJoin);
  QBrush::~QBrush(local_110);
  bVar4 = (pQVar15->super_QAbstractItemViewPrivate).alternatingColors & 1;
  bVar5 = QWidget::isRightToLeft((QWidget *)0x8b72f7);
  local_118 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = (pQVar15->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport;
  local_338 = (QPaintDevice *)0x0;
  if (pQVar2 != (QWidget *)0x0) {
    local_338 = &pQVar2->super_QPaintDevice;
  }
  QPainter::QPainter((QPainter *)&local_118,local_338);
  iVar8 = QHeaderView::count((QHeaderView *)
                             CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  if (iVar8 != 0) {
    iVar8 = QHeaderView::count((QHeaderView *)
                               CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    if (iVar8 != 0) {
      bVar6 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractItemDelegate> *)0x8b7397);
      if (bVar6) {
        iVar8 = QHeaderView::length((QHeaderView *)
                                    CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
        iVar9 = QHeaderView::offset((QHeaderView *)
                                    CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
        iVar9 = (iVar8 - iVar9) - (uint)!bVar5;
        iVar10 = QHeaderView::length((QHeaderView *)
                                     CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
        iVar11 = QHeaderView::offset((QHeaderView *)
                                     CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
        local_11c = QHeaderView::visualIndexAt
                              ((QHeaderView *)
                               CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                               in_stack_fffffffffffffbc4);
        local_120 = 0;
        piVar17 = qMax<int>(&local_11c,&local_120);
        iVar8 = *piVar17;
        QWidget::height((QWidget *)0x8b7488);
        local_2a8 = QHeaderView::visualIndexAt
                              ((QHeaderView *)
                               CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                               in_stack_fffffffffffffbc4);
        if (local_2a8 == -1) {
          pQVar3 = (pQVar15->super_QAbstractItemViewPrivate).model;
          QPersistentModelIndex::operator_cast_to_QModelIndex(local_138);
          local_2a8 = (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3,local_138);
          local_2a8 = local_2a8 + -1;
        }
        local_13c = QHeaderView::visualIndexAt
                              ((QHeaderView *)
                               CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                               in_stack_fffffffffffffbc4);
        QWidget::width((QWidget *)0x8b752e);
        local_140 = QHeaderView::visualIndexAt
                              ((QHeaderView *)
                               CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                               in_stack_fffffffffffffbc4);
        if (bVar5) {
          qSwap<int>((int *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                     (int *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        }
        if (local_13c == -1) {
          local_13c = 0;
        }
        if (local_140 == -1) {
          local_140 = QHeaderView::count((QHeaderView *)
                                         CONCAT44(in_stack_fffffffffffffbb4,
                                                  in_stack_fffffffffffffbb0));
          local_140 = local_140 + -1;
        }
        local_158.d.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_158.d.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        local_158.d.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        QBitArray::QBitArray
                  (&local_158,(long)(((local_2a8 - iVar8) + 1) * ((local_140 - local_13c) + 1)),
                   false);
        local_160.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QPaintEvent::region(in_RSI);
        QRegion::translated((QRegion *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8)
                            ,(QPoint *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0)
                           );
        bVar6 = QTableViewPrivate::hasSpans((QTableViewPrivate *)0x8b763e);
        if (bVar6) {
          in_stack_fffffffffffffbb0 = local_13c;
          in_stack_fffffffffffffbb8 = local_140;
          QTableViewPrivate::drawAndClipSpans
                    (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
                     (QPainter *)
                     CONCAT17(in_stack_fffffffffffffc5f,
                              CONCAT16(in_stack_fffffffffffffc5e,in_stack_fffffffffffffc58)),
                     in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc44,
                     in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,in_stack_fffffffffffffe30);
          in_stack_fffffffffffffba8 = local_2a8;
        }
        local_2b8 = (undefined8 *)QRegion::begin();
        puVar18 = (undefined8 *)QRegion::end();
        for (; local_2b8 != puVar18; local_2b8 = local_2b8 + 2) {
          local_170 = *local_2b8;
          local_168 = local_2b8[1];
          local_174 = QRect::bottom((QRect *)0x8b7749);
          local_178 = (iVar10 - iVar11) + -1;
          qMin<int>(&local_174,&local_178);
          QRect::setBottom((QRect *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                           in_stack_fffffffffffffbac);
          if (bVar5) {
            local_17c = QRect::left((QRect *)0x8b7799);
            local_180 = QWidget::width((QWidget *)0x8b77b4);
            local_180 = local_180 - iVar9;
            qMax<int>(&local_17c,&local_180);
            QRect::setLeft((QRect *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                           in_stack_fffffffffffffbac);
          }
          else {
            local_184 = QRect::right((QRect *)0x8b77f5);
            local_188 = iVar9;
            qMin<int>(&local_184,&local_188);
            QRect::setRight((QRect *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                            in_stack_fffffffffffffbac);
          }
          bVar6 = QRect::isValid((QRect *)CONCAT44(in_stack_fffffffffffffbb4,
                                                   in_stack_fffffffffffffbb0));
          if (bVar6) {
            QRect::left((QRect *)0x8b7861);
            local_18c = QHeaderView::visualIndexAt
                                  ((QHeaderView *)
                                   CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                                   in_stack_fffffffffffffbc4);
            QRect::right((QRect *)0x8b7894);
            local_190 = QHeaderView::visualIndexAt
                                  ((QHeaderView *)
                                   CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                                   in_stack_fffffffffffffbc4);
            if (bVar5) {
              qSwap<int>((int *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                         (int *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
            }
            if (local_18c == -1) {
              local_18c = 0;
            }
            if (local_190 == -1) {
              local_190 = QHeaderView::count((QHeaderView *)
                                             CONCAT44(in_stack_fffffffffffffbb4,
                                                      in_stack_fffffffffffffbb0));
              local_190 = local_190 + -1;
            }
            QRect::bottom((QRect *)0x8b791c);
            local_2c4 = QHeaderView::visualIndexAt
                                  ((QHeaderView *)
                                   CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                                   in_stack_fffffffffffffbc4);
            if (local_2c4 == -1) {
              local_2c4 = QHeaderView::count((QHeaderView *)
                                             CONCAT44(in_stack_fffffffffffffbb4,
                                                      in_stack_fffffffffffffbb0));
              local_2c4 = local_2c4 + -1;
            }
            local_2c8 = 0;
            local_2c9 = 0;
            if (bVar4 == 0) {
LAB_008b7a88:
              QRect::top((QRect *)0x8b7aa5);
              local_2c8 = QHeaderView::visualIndexAt
                                    ((QHeaderView *)
                                     CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                                     in_stack_fffffffffffffbc4);
              local_2c9 = 0;
              if ((local_2c8 & 1) != 0) {
                local_2c9 = bVar4;
              }
            }
            else {
              bVar6 = QHeaderView::sectionsHidden
                                ((QHeaderView *)
                                 CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
              if (!bVar6) goto LAB_008b7a88;
              iVar12 = QHeaderView::offset((QHeaderView *)
                                           CONCAT44(in_stack_fffffffffffffbb4,
                                                    in_stack_fffffffffffffbb0));
              QHeaderView::logicalIndex
                        ((QHeaderView *)
                         CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                         in_stack_fffffffffffffbb4);
              local_2d8 = 0;
              while( true ) {
                iVar13 = QHeaderView::sectionSize
                                   ((QHeaderView *)
                                    CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                                    in_stack_fffffffffffffbc4);
                local_2d8 = iVar13 + local_2d8;
                if (iVar12 < local_2d8 || local_2c4 <= (int)local_2c8) break;
                QHeaderView::logicalIndex
                          ((QHeaderView *)
                           CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                           in_stack_fffffffffffffbb4);
                if (bVar4 != 0) {
                  bVar6 = QHeaderView::isSectionHidden
                                    ((QHeaderView *)
                                     CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                                     in_stack_fffffffffffffbc4);
                  if (!bVar6) {
                    local_2c9 = (local_2c9 ^ 0xff) & 1;
                  }
                }
                local_2c8 = local_2c8 + 1;
              }
            }
            if ((local_2c8 != 0xffffffff) && ((int)local_2c8 <= local_2c4)) {
              for (local_2dc = local_2c8; (int)local_2dc <= local_2c4; local_2dc = local_2dc + 1) {
                iVar12 = QHeaderView::logicalIndex
                                   ((QHeaderView *)
                                    CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                                    in_stack_fffffffffffffbb4);
                bVar6 = QHeaderView::isSectionHidden
                                  ((QHeaderView *)
                                   CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                                   in_stack_fffffffffffffbc4);
                if (!bVar6) {
                  rowViewportPosition((QTableView *)
                                      CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                                      in_stack_fffffffffffffbac);
                  QPoint::y((QPoint *)0x8b7b94);
                  rowHeight((QTableView *)
                            CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                            in_stack_fffffffffffffbac);
                  for (local_2ec = local_18c; local_2ec <= local_190; local_2ec = local_2ec + 1) {
                    iVar13 = ((local_2dc - iVar8) * ((local_140 - local_13c) + 1) + local_2ec) -
                             local_13c;
                    if (-1 < iVar13) {
                      lVar19 = (long)iVar13;
                      qVar20 = QBitArray::size((QBitArray *)
                                               CONCAT44(in_stack_fffffffffffffbb4,
                                                        in_stack_fffffffffffffbb0));
                      if (lVar19 < qVar20) {
                        bVar6 = QBitArray::testBit((QBitArray *)
                                                   CONCAT44(in_stack_fffffffffffffbb4,
                                                            in_stack_fffffffffffffbb0),
                                                   CONCAT44(in_stack_fffffffffffffbac,
                                                            in_stack_fffffffffffffba8));
                        if (!bVar6) {
                          QBitArray::setBit((QBitArray *)
                                            CONCAT44(in_stack_fffffffffffffbac,
                                                     in_stack_fffffffffffffba8),0x8b7c89);
                          iVar13 = QHeaderView::logicalIndex
                                             ((QHeaderView *)
                                              CONCAT44(in_stack_fffffffffffffbbc,
                                                       in_stack_fffffffffffffbb8),
                                              in_stack_fffffffffffffbb4);
                          bVar6 = QHeaderView::isSectionHidden
                                            ((QHeaderView *)
                                             CONCAT44(in_stack_fffffffffffffbcc,
                                                      in_stack_fffffffffffffbc8),
                                             in_stack_fffffffffffffbc4);
                          if (!bVar6) {
                            columnViewportPosition
                                      ((QTableView *)
                                       CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0)
                                       ,in_stack_fffffffffffffbac);
                            QPoint::x((QPoint *)0x8b7ceb);
                            columnWidth((QTableView *)
                                        CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0
                                                ),in_stack_fffffffffffffbac);
                            local_1a8 = &DAT_aaaaaaaaaaaaaaaa;
                            local_1a0 = &DAT_aaaaaaaaaaaaaaaa;
                            local_198 = &DAT_aaaaaaaaaaaaaaaa;
                            pQVar3 = (pQVar15->super_QAbstractItemViewPrivate).model;
                            QPersistentModelIndex::operator_cast_to_QModelIndex(local_1c0);
                            (**(code **)(*(long *)pQVar3 + 0x60))(&local_1a8,pQVar3,iVar12,iVar13);
                            bVar6 = QModelIndex::isValid
                                              ((QModelIndex *)
                                               CONCAT44(in_stack_fffffffffffffbb4,
                                                        in_stack_fffffffffffffbb0));
                            if (bVar6) {
                              QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffbbc,
                                                             in_stack_fffffffffffffbb8),
                                           in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0,
                                           in_stack_fffffffffffffbac,in_stack_fffffffffffffba8);
                              local_c8 = (undefined1 *)
                                         CONCAT44(uStack_1cc,in_stack_fffffffffffffe30);
                              puStack_c0 = local_1c8;
                              if (bVar4 != 0) {
                                if (local_2c9 == 0) {
                                  QFlags<QStyleOptionViewItem::ViewItemFeature>::operator&=
                                            ((QFlags<QStyleOptionViewItem::ViewItemFeature> *)
                                             ((long)&uStack_70 + 4),-3);
                                }
                                else {
                                  QFlags<QStyleOptionViewItem::ViewItemFeature>::operator|=
                                            ((QFlags<QStyleOptionViewItem::ViewItemFeature> *)
                                             ((long)&uStack_70 + 4),Alternate);
                                }
                              }
                              QTableViewPrivate::drawCell
                                        ((QTableViewPrivate *)
                                         CONCAT44(in_stack_fffffffffffffbec,
                                                  in_stack_fffffffffffffbe8),
                                         (QPainter *)
                                         CONCAT44(in_stack_fffffffffffffbe4,
                                                  in_stack_fffffffffffffbe0),
                                         (QStyleOptionViewItem *)
                                         CONCAT44(in_stack_fffffffffffffbdc,
                                                  in_stack_fffffffffffffbd8),
                                         (QModelIndex *)
                                         CONCAT44(in_stack_fffffffffffffbd4,
                                                  in_stack_fffffffffffffbd0));
                            }
                          }
                        }
                      }
                    }
                  }
                  local_3d1 = 0;
                  if (local_2c9 == 0) {
                    local_3d1 = bVar4;
                  }
                  local_2c9 = local_3d1;
                }
              }
              if ((bVar1 & 1U) != 0) {
                while( true ) {
                  QHeaderView::logicalIndex
                            ((QHeaderView *)
                             CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                             in_stack_fffffffffffffbb4);
                  bVar6 = QHeaderView::isSectionHidden
                                    ((QHeaderView *)
                                     CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                                     in_stack_fffffffffffffbc4);
                  if (!bVar6) break;
                  local_2c4 = local_2c4 + -1;
                }
                pQVar21 = (QPen *)QPainter::pen();
                QPen::QPen((QPen *)&stack0xfffffffffffffe28,pQVar21);
                QPainter::setPen((QPen *)&local_118);
                for (local_300 = local_2c8; (int)local_300 <= local_2c4; local_300 = local_300 + 1)
                {
                  QHeaderView::logicalIndex
                            ((QHeaderView *)
                             CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                             in_stack_fffffffffffffbb4);
                  bVar6 = QHeaderView::isSectionHidden
                                    ((QHeaderView *)
                                     CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                                     in_stack_fffffffffffffbc4);
                  if (!bVar6) {
                    rowViewportPosition((QTableView *)
                                        CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0
                                                ),in_stack_fffffffffffffbac);
                    QPoint::y((QPoint *)0x8b804b);
                    rowHeight((QTableView *)
                              CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                              in_stack_fffffffffffffbac);
                    QRect::left((QRect *)0x8b80c4);
                    QRect::right((QRect *)0x8b80f3);
                    QLineF::QLineF((QLineF *)
                                   CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                                   (qreal)CONCAT44(in_stack_fffffffffffffbcc,
                                                   in_stack_fffffffffffffbc8),
                                   (qreal)CONCAT44(in_stack_fffffffffffffbc4,
                                                   in_stack_fffffffffffffbc0),
                                   (qreal)CONCAT44(in_stack_fffffffffffffbbc,
                                                   in_stack_fffffffffffffbb8),
                                   (qreal)CONCAT44(in_stack_fffffffffffffbb4,
                                                   in_stack_fffffffffffffbb0));
                    QLineF::translated((QLineF *)
                                       CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
                                       ,(qreal)CONCAT44(in_stack_fffffffffffffbd4,
                                                        in_stack_fffffffffffffbd0),
                                       (qreal)CONCAT44(in_stack_fffffffffffffbcc,
                                                       in_stack_fffffffffffffbc8));
                    QPainter::drawLine((QPainter *)
                                       CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0)
                                       ,(QLineF *)
                                        CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8
                                                ));
                  }
                }
                for (local_310 = local_18c; local_310 <= local_190; local_310 = local_310 + 1) {
                  QHeaderView::logicalIndex
                            ((QHeaderView *)
                             CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                             in_stack_fffffffffffffbb4);
                  bVar6 = QHeaderView::isSectionHidden
                                    ((QHeaderView *)
                                     CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                                     in_stack_fffffffffffffbc4);
                  if (!bVar6) {
                    columnViewportPosition
                              ((QTableView *)
                               CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                               in_stack_fffffffffffffbac);
                    QPoint::x((QPoint *)0x8b81f1);
                    if (!bVar5) {
                      columnWidth((QTableView *)
                                  CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                                  in_stack_fffffffffffffbac);
                    }
                    QRect::top((QRect *)0x8b828a);
                    QRect::bottom((QRect *)0x8b82b0);
                    QLineF::QLineF((QLineF *)
                                   CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                                   (qreal)CONCAT44(in_stack_fffffffffffffbcc,
                                                   in_stack_fffffffffffffbc8),
                                   (qreal)CONCAT44(in_stack_fffffffffffffbc4,
                                                   in_stack_fffffffffffffbc0),
                                   (qreal)CONCAT44(in_stack_fffffffffffffbbc,
                                                   in_stack_fffffffffffffbb8),
                                   (qreal)CONCAT44(in_stack_fffffffffffffbb4,
                                                   in_stack_fffffffffffffbb0));
                    QLineF::translated((QLineF *)
                                       CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
                                       ,(qreal)CONCAT44(in_stack_fffffffffffffbd4,
                                                        in_stack_fffffffffffffbd0),
                                       (qreal)CONCAT44(in_stack_fffffffffffffbcc,
                                                       in_stack_fffffffffffffbc8));
                    QPainter::drawLine((QPainter *)
                                       CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0)
                                       ,(QLineF *)
                                        CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8
                                                ));
                  }
                }
                pQVar16 = QWidget::style((QWidget *)
                                         CONCAT44(in_stack_fffffffffffffbac,
                                                  in_stack_fffffffffffffba8));
                iVar12 = (**(code **)(*(long *)pQVar16 + 0xf0))(pQVar16,0x76,&local_d8,in_RDI,0);
                if (iVar12 != 0) {
                  bVar6 = QWidget::isHidden((QWidget *)0x8b8379);
                  if (bVar6) {
                    QHeaderView::logicalIndex
                              ((QHeaderView *)
                               CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                               in_stack_fffffffffffffbb4);
                    bVar6 = QHeaderView::isSectionHidden
                                      ((QHeaderView *)
                                       CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8)
                                       ,in_stack_fffffffffffffbc4);
                    if (!bVar6) {
                      iVar14 = rowViewportPosition((QTableView *)
                                                   CONCAT44(in_stack_fffffffffffffbb4,
                                                            in_stack_fffffffffffffbb0),
                                                   in_stack_fffffffffffffbac);
                      iVar13 = QPoint::y((QPoint *)0x8b83de);
                      iVar14 = iVar14 + iVar13;
                      iVar13 = QRect::top((QRect *)0x8b8405);
                      if (iVar14 == iVar13) {
                        in_stack_fffffffffffffbe8 = QRect::left((QRect *)0x8b841c);
                        QRect::right((QRect *)0x8b8438);
                        QPainter::drawLine((QPainter *)
                                           CONCAT44(in_stack_fffffffffffffbcc,
                                                    in_stack_fffffffffffffbc8),
                                           in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0,
                                           in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8);
                        in_stack_fffffffffffffbec = iVar14;
                      }
                    }
                  }
                }
                if (iVar12 != 0) {
                  bVar6 = QWidget::isHidden((QWidget *)0x8b8476);
                  if (bVar6) {
                    QHeaderView::logicalIndex
                              ((QHeaderView *)
                               CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                               in_stack_fffffffffffffbb4);
                    bVar6 = QHeaderView::isSectionHidden
                                      ((QHeaderView *)
                                       CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8)
                                       ,in_stack_fffffffffffffbc4);
                    if (!bVar6) {
                      in_stack_fffffffffffffbe4 =
                           columnViewportPosition
                                     ((QTableView *)
                                      CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                                      in_stack_fffffffffffffbac);
                      local_32c = QPoint::x((QPoint *)0x8b84db);
                      local_32c = in_stack_fffffffffffffbe4 + local_32c;
                      bVar6 = QWidget::isLeftToRight((QWidget *)0x8b84f7);
                      if (!bVar6) {
                        iVar12 = columnWidth((QTableView *)
                                             CONCAT44(in_stack_fffffffffffffbb4,
                                                      in_stack_fffffffffffffbb0),
                                             in_stack_fffffffffffffbac);
                        local_32c = iVar12 + -1 + local_32c;
                      }
                      bVar6 = QWidget::isLeftToRight((QWidget *)0x8b852d);
                      if (bVar6) {
                        in_stack_fffffffffffffbe0 = local_32c;
                        iVar12 = QRect::left((QRect *)0x8b854b);
                        if (in_stack_fffffffffffffbe0 == iVar12) {
                          in_stack_fffffffffffffbd4 = local_32c;
                          in_stack_fffffffffffffbd8 = QRect::top((QRect *)0x8b856d);
                          in_stack_fffffffffffffbdc = local_32c;
                          QRect::bottom((QRect *)0x8b8589);
                          QPainter::drawLine((QPainter *)
                                             CONCAT44(in_stack_fffffffffffffbcc,
                                                      in_stack_fffffffffffffbc8),
                                             in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0,
                                             in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8);
                        }
                      }
                      bVar6 = QWidget::isLeftToRight((QWidget *)0x8b85b2);
                      if (!bVar6) {
                        in_stack_fffffffffffffbd0 = local_32c;
                        iVar12 = QRect::right((QRect *)0x8b85ce);
                        if (in_stack_fffffffffffffbd0 == iVar12) {
                          in_stack_fffffffffffffbc4 = local_32c;
                          in_stack_fffffffffffffbc8 = QRect::top((QRect *)0x8b85f0);
                          QRect::bottom((QRect *)0x8b860c);
                          QPainter::drawLine((QPainter *)
                                             CONCAT44(local_32c,in_stack_fffffffffffffbc8),
                                             in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0,
                                             in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8);
                          in_stack_fffffffffffffbcc = local_32c;
                        }
                      }
                    }
                  }
                }
                QPainter::setPen((QPen *)&local_118);
                QPen::~QPen((QPen *)&stack0xfffffffffffffe28);
              }
            }
          }
        }
        QAbstractItemViewPrivate::paintDropIndicator
                  ((QAbstractItemViewPrivate *)
                   CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   (QPainter *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        QRegion::~QRegion(&local_160);
        QBitArray::~QBitArray((QBitArray *)0x8b8698);
      }
    }
  }
  QPainter::~QPainter((QPainter *)&local_118);
  QPen::~QPen((QPen *)&local_108);
  QStyleOptionViewItem::~QStyleOptionViewItem
            ((QStyleOptionViewItem *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableView::paintEvent(QPaintEvent *event)
{
    Q_D(QTableView);
    // setup temp variables for the painting
    QStyleOptionViewItem option;
    initViewItemOption(&option);
    const QPoint offset = d->scrollDelayOffset;
    const bool showGrid = d->showGrid;
    const int gridSize = showGrid ? 1 : 0;
    const int gridHint = style()->styleHint(QStyle::SH_Table_GridLineColor, &option, this);
    const QColor gridColor = QColor::fromRgba(static_cast<QRgb>(gridHint));
    const QPen gridPen = QPen(gridColor, 1, d->gridStyle);
    const QHeaderView *verticalHeader = d->verticalHeader;
    const QHeaderView *horizontalHeader = d->horizontalHeader;
    const bool alternate = d->alternatingColors;
    const bool rightToLeft = isRightToLeft();

    QPainter painter(d->viewport);

    // if there's nothing to do, clear the area and return
    if (horizontalHeader->count() == 0 || verticalHeader->count() == 0 || !d->itemDelegate)
        return;

    const int x = horizontalHeader->length() - horizontalHeader->offset() - (rightToLeft ? 0 : 1);
    const int y = verticalHeader->length() - verticalHeader->offset() - 1;

    //firstVisualRow is the visual index of the first visible row.  lastVisualRow is the visual index of the last visible Row.
    //same goes for ...VisualColumn
    int firstVisualRow = qMax(verticalHeader->visualIndexAt(0),0);
    int lastVisualRow = verticalHeader->visualIndexAt(verticalHeader->height());
    if (lastVisualRow == -1)
        lastVisualRow = d->model->rowCount(d->root) - 1;

    int firstVisualColumn = horizontalHeader->visualIndexAt(0);
    int lastVisualColumn = horizontalHeader->visualIndexAt(horizontalHeader->width());
    if (rightToLeft)
        qSwap(firstVisualColumn, lastVisualColumn);
    if (firstVisualColumn == -1)
        firstVisualColumn = 0;
    if (lastVisualColumn == -1)
        lastVisualColumn = horizontalHeader->count() - 1;

    QBitArray drawn((lastVisualRow - firstVisualRow + 1) * (lastVisualColumn - firstVisualColumn + 1));

    const QRegion region = event->region().translated(offset);

    if (d->hasSpans()) {
        d->drawAndClipSpans(region, &painter, option, &drawn,
                             firstVisualRow, lastVisualRow, firstVisualColumn, lastVisualColumn);
    }

    for (QRect dirtyArea : region) {
        dirtyArea.setBottom(qMin(dirtyArea.bottom(), int(y)));
        if (rightToLeft) {
            dirtyArea.setLeft(qMax(dirtyArea.left(), d->viewport->width() - int(x)));
        } else {
            dirtyArea.setRight(qMin(dirtyArea.right(), int(x)));
        }
        // dirtyArea may be invalid when the horizontal header is not stretched
        if (!dirtyArea.isValid())
            continue;

        // get the horizontal start and end visual sections
        int left = horizontalHeader->visualIndexAt(dirtyArea.left());
        int right = horizontalHeader->visualIndexAt(dirtyArea.right());
        if (rightToLeft)
            qSwap(left, right);
        if (left == -1) left = 0;
        if (right == -1) right = horizontalHeader->count() - 1;

        // get the vertical start and end visual sections and if alternate color
        int bottom = verticalHeader->visualIndexAt(dirtyArea.bottom());
        if (bottom == -1) bottom = verticalHeader->count() - 1;
        int top = 0;
        bool alternateBase = false;
        if (alternate && verticalHeader->sectionsHidden()) {
            const int verticalOffset = verticalHeader->offset();
            int row = verticalHeader->logicalIndex(top);
            for (int y = 0;
                 ((y += verticalHeader->sectionSize(top)) <= verticalOffset) && (top < bottom);
                 ++top) {
                row = verticalHeader->logicalIndex(top);
                if (alternate && !verticalHeader->isSectionHidden(row))
                    alternateBase = !alternateBase;
            }
        } else {
            top = verticalHeader->visualIndexAt(dirtyArea.top());
            alternateBase = (top & 1) && alternate;
        }
        if (top == -1 || top > bottom)
            continue;

        // Paint each row item
        for (int visualRowIndex = top; visualRowIndex <= bottom; ++visualRowIndex) {
            int row = verticalHeader->logicalIndex(visualRowIndex);
            if (verticalHeader->isSectionHidden(row))
                continue;
            int rowY = rowViewportPosition(row);
            rowY += offset.y();
            int rowh = rowHeight(row) - gridSize;

            // Paint each column item
            for (int visualColumnIndex = left; visualColumnIndex <= right; ++visualColumnIndex) {
                int currentBit = (visualRowIndex - firstVisualRow) * (lastVisualColumn - firstVisualColumn + 1)
                        + visualColumnIndex - firstVisualColumn;

                if (currentBit < 0 || currentBit >= drawn.size() || drawn.testBit(currentBit))
                    continue;
                drawn.setBit(currentBit);

                int col = horizontalHeader->logicalIndex(visualColumnIndex);
                if (horizontalHeader->isSectionHidden(col))
                    continue;
                int colp = columnViewportPosition(col);
                colp += offset.x();
                int colw = columnWidth(col) - gridSize;

                const QModelIndex index = d->model->index(row, col, d->root);
                if (index.isValid()) {
                    option.rect = QRect(colp + (showGrid && rightToLeft ? 1 : 0), rowY, colw, rowh);
                    if (alternate) {
                        if (alternateBase)
                            option.features |= QStyleOptionViewItem::Alternate;
                        else
                            option.features &= ~QStyleOptionViewItem::Alternate;
                    }
                    d->drawCell(&painter, option, index);
                }
            }
            alternateBase = !alternateBase && alternate;
        }

        if (showGrid) {
            // Find the bottom right (the last rows/columns might be hidden)
            while (verticalHeader->isSectionHidden(verticalHeader->logicalIndex(bottom))) --bottom;
            QPen old = painter.pen();
            painter.setPen(gridPen);
            // Paint each row
            for (int visualIndex = top; visualIndex <= bottom; ++visualIndex) {
                int row = verticalHeader->logicalIndex(visualIndex);
                if (verticalHeader->isSectionHidden(row))
                    continue;
                int rowY = rowViewportPosition(row);
                rowY += offset.y();
                int rowh = rowHeight(row) - gridSize;
                QLineF line(dirtyArea.left(), rowY + rowh, dirtyArea.right(), rowY + rowh);
                painter.drawLine(line.translated(0.5, 0.5));
            }

            // Paint each column
            for (int h = left; h <= right; ++h) {
                int col = horizontalHeader->logicalIndex(h);
                if (horizontalHeader->isSectionHidden(col))
                    continue;
                int colp = columnViewportPosition(col);
                colp += offset.x();
                if (!rightToLeft)
                    colp +=  columnWidth(col) - gridSize;
                QLineF line(colp, dirtyArea.top(), colp, dirtyArea.bottom());
                painter.drawLine(line.translated(0.5, 0.5));
            }
            const bool drawWhenHidden = style()->styleHint(QStyle::SH_Table_AlwaysDrawLeftTopGridLines,
                                                           &option, this);
            if (drawWhenHidden && horizontalHeader->isHidden()) {
                const int row = verticalHeader->logicalIndex(top);
                if (!verticalHeader->isSectionHidden(row)) {
                    const int rowY = rowViewportPosition(row) + offset.y();
                    if (rowY == dirtyArea.top())
                        painter.drawLine(dirtyArea.left(), rowY, dirtyArea.right(), rowY);
                }
            }
            if (drawWhenHidden && verticalHeader->isHidden()) {
                const int col = horizontalHeader->logicalIndex(left);
                if (!horizontalHeader->isSectionHidden(col)) {
                    int colX = columnViewportPosition(col) + offset.x();
                    if (!isLeftToRight())
                        colX += columnWidth(left) - 1;
                    if (isLeftToRight() && colX == dirtyArea.left())
                        painter.drawLine(colX, dirtyArea.top(), colX, dirtyArea.bottom());
                    if (!isLeftToRight() && colX == dirtyArea.right())
                        painter.drawLine(colX, dirtyArea.top(), colX, dirtyArea.bottom());
                }
            }
            painter.setPen(old);
        }
    }

#if QT_CONFIG(draganddrop)
    // Paint the dropIndicator
    d->paintDropIndicator(&painter);
#endif
}